

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::BoxArray(BoxArray *this,BoxArray *rhs,BATransformer *trans)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  undefined8 uVar8;
  int j;
  BATransformer *in_RDX;
  int i;
  shared_ptr<amrex::BARef> *in_RDI;
  IntVect IVar9;
  IntVect *in_stack_00000020;
  BATransformer *in_stack_00000028;
  shared_ptr<amrex::BARef> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 local_b8;
  int local_b0;
  undefined8 local_a8;
  int local_a0;
  int local_98 [3];
  undefined8 local_88;
  int local_80;
  int local_7c [2];
  int local_74;
  IntVect local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  in_RDI[4].super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)((long)&in_RDX->m_op + 0x3c);
  peVar1 = *(element_type **)in_RDX;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&in_RDX->m_op + 4);
  peVar3 = *(element_type **)((long)&in_RDX->m_op + 0xc);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&in_RDX->m_op + 0x14);
  peVar5 = *(element_type **)((long)&in_RDX->m_op + 0x1c);
  p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&in_RDX->m_op + 0x24);
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&in_RDX->m_op + 0x34);
  in_RDI[3].super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)((long)&in_RDX->m_op + 0x2c);
  in_RDI[3].super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var7;
  in_RDI[2].super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  in_RDI[2].super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var6;
  in_RDI[1].super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  in_RDI[1].super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  (in_RDI->super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
  (in_RDI->super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var2;
  std::shared_ptr<amrex::BARef>::shared_ptr(in_RDI,in_stack_ffffffffffffff28);
  std::shared_ptr<amrex::BoxList>::shared_ptr((shared_ptr<amrex::BoxList> *)0x1251f5b);
  IVar9 = crseRatio((BoxArray *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  local_98[2] = IVar9.vect[2];
  local_80 = local_98[2];
  local_98._0_8_ = IVar9.vect._0_8_;
  local_88._0_4_ = local_98[0];
  local_88._4_4_ = local_98[1];
  local_98 = IVar9.vect;
  IVar9 = BATransformer::coarsen_ratio(in_RDX);
  local_b0 = IVar9.vect[2];
  local_a0 = local_b0;
  local_b8 = IVar9.vect._0_8_;
  local_a8 = local_b8;
  uVar8 = local_a8;
  local_28 = &local_a8;
  local_c = 0;
  local_a8._0_4_ = IVar9.vect[0];
  i = (int)local_88 * (int)local_a8;
  local_1c = 1;
  local_a8._4_4_ = IVar9.vect[1];
  j = local_88._4_4_ * local_a8._4_4_;
  local_2c = 2;
  local_a8 = uVar8;
  local_18 = local_28;
  local_8 = local_28;
  IntVect::IntVect(&local_38,i,j,local_80 * local_b0);
  local_7c[0] = local_38.vect[0];
  local_7c[1] = local_38.vect[1];
  local_74 = local_38.vect[2];
  BATransformer::set_coarsen_ratio(in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

BoxArray::BoxArray (const BoxArray& rhs, const BATransformer& trans)
    :
    m_bat(trans),
    m_ref(rhs.m_ref)
{
    BL_ASSERT(rhs.ixType().cellCentered());  // rhs must be cell-centered.
    m_bat.set_coarsen_ratio(rhs.crseRatio() * trans.coarsen_ratio());
}